

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O2

_Bool accept_rec(automaton *a,char *word,char *state_list)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char (*__s) [101];
  int i;
  ulong uVar6;
  bool bVar7;
  char local_438 [8];
  char state_list_extended [1000];
  
  sVar3 = strlen(word);
  sVar4 = strlen(state_list);
  if (sVar3 <= sVar4 - 1) {
    _Var2 = is_acceptable(a,state_list[sVar4 - 1]);
    return _Var2;
  }
  cVar1 = state_list[sVar4 - 1] + -1;
  __s = a->transitions + (long)(char)(word[sVar4 - 1] + -0x61) + a->alphabet_size * (long)cVar1;
  sVar3 = strlen(*__s);
  uVar5 = 0;
  if (0 < (int)sVar3) {
    uVar5 = sVar3 & 0xffffffff;
  }
  if ((int)cVar1 < (int)a->universal_states_size) {
    uVar6 = 0;
    do {
      bVar7 = uVar5 == uVar6;
      if (bVar7) {
        return bVar7;
      }
      strcpy(local_438,state_list);
      sVar3 = strlen(local_438);
      local_438[sVar3] = (*__s)[uVar6];
      local_438[sVar3 + 1] = '\0';
      _Var2 = accept_rec(a,word,local_438);
      uVar6 = uVar6 + 1;
    } while (_Var2);
  }
  else {
    uVar6 = 0;
    do {
      bVar7 = uVar5 != uVar6;
      if (uVar5 == uVar6) {
        return bVar7;
      }
      strcpy(local_438,state_list);
      sVar3 = strlen(local_438);
      local_438[sVar3] = (*__s)[uVar6];
      local_438[sVar3 + 1] = '\0';
      _Var2 = accept_rec(a,word,local_438);
      uVar6 = uVar6 + 1;
    } while (!_Var2);
  }
  return bVar7;
}

Assistant:

bool accept_rec(const automaton *a, const char *word, const char *state_list) {
    size_t w_len = strlen(word);
    size_t depth = strlen(state_list)-1;

    if(depth >= w_len) {
        return is_acceptable(a, state_list[depth]);
    }
    const char * following_states = get_following_states(a, state_list[depth], word[depth]);
    size_t following_states_length = strlen(following_states);
    if(is_existential(a, state_list[depth])) {
        // need to accept_rec any of following states
        int i;
        for(i=0; i<(int)following_states_length; i++) {
            char state_list_extended[WORD_LEN_MAX]; // states list for given word is equal its length
            strcpy(state_list_extended, state_list);
            size_t fs_len = strlen(state_list_extended);
            // append one of possible following states to current state_list
            state_list_extended[fs_len] = following_states[i];
            state_list_extended[fs_len+1] = '\0';
            assert(strlen(state_list_extended) == strlen(state_list)+1);

            if(accept_rec(a, word, state_list_extended)) {
                return true;
            }
        }
        assert(i == following_states_length);
        return false; // no state_list was accepted
    }
    assert(is_universal(a, state_list[depth]));
    int i;
    for(i=0; i<(int)following_states_length; i++) {
        char state_list_extended[WORD_LEN_MAX]; // states list for given word is equal its length
        strcpy(state_list_extended, state_list);
        size_t fs_len = strlen(state_list_extended);
        // append one of possible following states to current state_list
        state_list_extended[fs_len] = following_states[i];
        state_list_extended[fs_len+1] = '\0';
        assert(strlen(state_list_extended) == strlen(state_list)+1);

        if(!accept_rec(a, word, state_list_extended)) {
            return false;
        }
    }
    assert(i == following_states_length);
    return true; // all states were accepted
}